

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O0

void log_outgoing_frame(AMQP_VALUE performative)

{
  LOGGER_LOG p_Var1;
  AMQP_VALUE descriptor_00;
  char *pcVar2;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  char *performative_as_string;
  AMQP_VALUE descriptor;
  AMQP_VALUE performative_local;
  
  p_Var1 = xlogging_get_log_function();
  if ((p_Var1 != (LOGGER_LOG)0x0) &&
     (descriptor_00 = amqpvalue_get_inplace_descriptor(performative),
     descriptor_00 != (AMQP_VALUE)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_TRACE,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                ,"log_outgoing_frame",0x14d,0,"-> ");
    }
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      pcVar2 = get_frame_type_as_string(descriptor_00);
      (*p_Var1)(AZ_LOG_TRACE,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                ,"log_outgoing_frame",0x14e,0,"%s",pcVar2);
    }
    l = (LOGGER_LOG)0x0;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      l = (LOGGER_LOG)amqpvalue_to_string(performative);
      (*p_Var1)(AZ_LOG_TRACE,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                ,"log_outgoing_frame",0x150,1,"%s",l);
    }
    if (l != (LOGGER_LOG)0x0) {
      free(l);
    }
  }
  return;
}

Assistant:

static void log_outgoing_frame(AMQP_VALUE performative)
{
#ifdef NO_LOGGING
    UNUSED(performative);
#else
    AMQP_VALUE descriptor = amqpvalue_get_inplace_descriptor(performative);
    if (descriptor == NULL)
    {
        LogError("Error getting performative descriptor");
    }
    else
    {
        char* performative_as_string;
        LOG(AZ_LOG_TRACE, 0, "-> ");
        LOG(AZ_LOG_TRACE, 0, "%s", (char*)get_frame_type_as_string(descriptor));
        performative_as_string = NULL;
        LOG(AZ_LOG_TRACE, LOG_LINE, "%s", (performative_as_string = amqpvalue_to_string(performative)));
        if (performative_as_string != NULL)
        {
            free(performative_as_string);
        }
    }
#endif
}